

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.c
# Opt level: O0

void * SetData(node *p,dataid Id,datatype Type,void *Data)

{
  size_t __n;
  size_t sVar1;
  void *v;
  size_t Size;
  size_t i;
  void *Data_local;
  datatype Type_local;
  dataid Id_local;
  node *p_local;
  
  __n = Node_DataSize(p,Id,Type & 0x3f,Data,0x2a);
  for (Size = 0; (Size < __n && (*(char *)((long)Data + Size) == '\0')); Size = Size + 1) {
  }
  sVar1 = NodeTypeSize(Type);
  if (sVar1 == 0x100) {
    Node_RemoveData(p,Id,Type);
    if (Size < __n) {
      p_local = (node *)Node_AddData(p,Id,Type,Data);
    }
    else {
      p_local = (node *)0x0;
    }
  }
  else if (Size < __n) {
    p_local = (node *)Node_GetData(p,Id,Type);
    if (p_local == (node *)0x0) {
      p_local = (node *)Node_AddData(p,Id,Type,Data);
    }
    else {
      sVar1 = NodeTypeSize(Type);
      if (__n != sVar1) {
        __assert_fail("Size==NodeTypeSize(Type)",
                      "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/corec/corec/node/node.c"
                      ,0x23f,"void *SetData(node *, dataid, datatype, const void *)");
      }
      memcpy(p_local,Data,__n);
    }
  }
  else {
    Node_RemoveData(p,Id,Type);
    p_local = (node *)0x0;
  }
  return p_local;
}

Assistant:

static void* SetData(node* p, dataid Id, datatype Type, const void* Data)
{
    size_t i,Size = Node_DataSize(p,Id,Type&TYPE_MASK,Data,META_PARAM_UNSET); // META_PARAM_UNSET is neutral for the type

    for (i=0;i<Size;++i)
        if (((uint8_t*)Data)[i])
            break;

    if (NodeTypeSize(Type)==MAXDATA) // variable size
    {
        Node_RemoveData(p,Id,Type);

        // do not write anything if the value is 0
        if (i<Size)
            return Node_AddData(p,Id,Type,Data);
        else
            return NULL; // TODO: remove the pre-existing data with Node_RemoveData() ?
    }
    else
    {
        // do not write anything if the value is 0
        if (i<Size)
        {
            void *v = Node_GetData(p,Id,Type);
            if (!v)
                return Node_AddData(p,Id,Type,Data);
            else
            {
                assert(Size==NodeTypeSize(Type));
                memcpy(v,Data,Size);
            }
            return v;
        }
        else
            Node_RemoveData(p,Id,Type);
        return NULL;
    }
}